

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O3

pos_type __thiscall sai::ifstreambuf::seekpos(ifstreambuf *this,pos_type Position,openmode Mode)

{
  VirtualPage *Dest;
  bool bVar1;
  ulong uVar2;
  uint PageIndex;
  pos_type pVar3;
  
  if ((Mode & _S_in) != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
    PageIndex = (uint)Position._M_off >> 0xc;
    this->CurrentPage = PageIndex;
    if (PageIndex < this->PageCount) {
      Dest = &this->Buffer;
      bVar1 = FetchPage(this,PageIndex,Dest);
      if (bVar1) {
        *(VirtualPage **)&this->field_0x8 = Dest;
        *(ulong *)&this->field_0x10 = (ulong)((uint)Position._M_off & 0xfff) + (long)Dest;
        *(span<const_unsigned_int,_256UL> **)&this->field_0x18 = &this->Key;
        uVar2 = 1;
        goto LAB_00108dad;
      }
    }
  }
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  uVar2 = 0xffffffffffffffff;
LAB_00108dad:
  pVar3._M_state.__count = 0;
  pVar3._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  pVar3._M_off = uVar2;
  return pVar3;
}

Assistant:

std::streambuf::pos_type
	ifstreambuf::seekpos(std::streambuf::pos_type Position, std::ios::openmode Mode)
{
	if( Mode & std::ios::in )
	{
		CurrentPage = static_cast<std::uint32_t>(Position) / VirtualPage::PageSize;

		if( CurrentPage < PageCount )
		{
			if( FetchPage(CurrentPage, &Buffer) )
			{
				setg(
					reinterpret_cast<char*>(Buffer.u8.data()),
					reinterpret_cast<char*>(Buffer.u8.data()) + (Position % VirtualPage::PageSize),
					reinterpret_cast<char*>(Buffer.u8.data()) + VirtualPage::PageSize
				);
				return true;
			}
		}
	}
	setg(nullptr, nullptr, nullptr);
	return std::streampos(std::streamoff(-1));
}